

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  BYTE *pBVar8;
  uint maxSymbolValue_local;
  uint local_4c;
  HUF_CElt *local_48;
  BYTE *local_40;
  size_t local_38;
  
  if (((ulong)workSpace & 3) != 0) {
    return 0xffffffffffffffff;
  }
  if (wkspSize < 0x1800) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_40 = (BYTE *)((long)dst + dstSize);
  local_4c = 0xb;
  if (huffLog != 0) {
    local_4c = huffLog;
  }
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat == HUF_repeat_valid)) {
    sVar3 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_40,src,srcSize,nbStreams,oldHufTable,bmi2);
    return sVar3;
  }
  local_48 = (HUF_CElt *)CONCAT71(local_48._1_7_,repeat != (HUF_repeat *)0x0 && preferRepeat != 0);
  sVar3 = HIST_count_wksp((uint *)workSpace,&maxSymbolValue_local,src,srcSize,workSpace,wkspSize);
  if (sVar3 < 0xffffffffffffff89) {
    if (sVar3 == srcSize) {
      *(undefined1 *)dst = *src;
      sVar3 = 1;
      bVar1 = false;
    }
    else {
      bVar1 = (srcSize >> 7) + 4 < sVar3;
      sVar3 = 0;
    }
  }
  else {
    bVar1 = false;
  }
  if (!bVar1) {
    return sVar3;
  }
  if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) &&
     (-1 < (int)maxSymbolValue_local)) {
    lVar6 = 0;
    bVar1 = false;
    do {
      bVar1 = (bool)(bVar1 | (oldHufTable[lVar6].nbBits == '\0' &&
                             *(int *)((long)workSpace + lVar6 * 4) != 0));
      lVar6 = lVar6 + 1;
    } while ((ulong)maxSymbolValue_local + 1 != lVar6);
    if (bVar1) {
      *repeat = HUF_repeat_none;
    }
  }
  pBVar8 = (BYTE *)dst;
  if (((char)local_48 != '\0') && (*repeat != HUF_repeat_none)) goto LAB_00138fb5;
  local_4c = FSE_optimalTableLog_internal(local_4c,srcSize,maxSymbolValue_local,1);
  local_48 = (HUF_CElt *)((long)workSpace + 0x400);
  sVar4 = HUF_buildCTable_wksp
                    (local_48,(uint *)workSpace,maxSymbolValue_local,local_4c,
                     (void *)((long)workSpace + 0x800),0x1000);
  sVar2 = sVar4;
  if (sVar4 < 0xffffffffffffff89) {
    local_38 = sVar4;
    memset(local_48 + (maxSymbolValue_local + 1),0,(ulong)(maxSymbolValue_local + 1) * -4 + 0x400);
    local_4c = (uint)local_38;
    sVar4 = local_38;
    sVar2 = sVar3;
  }
  if (0xffffffffffffff88 < sVar4) {
    return sVar2;
  }
  sVar3 = HUF_writeCTable(dst,dstSize,local_48,maxSymbolValue_local,local_4c);
  if (sVar3 < 0xffffffffffffff89) {
    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
      if ((int)maxSymbolValue_local < 0) {
        uVar5 = 0;
      }
      else {
        lVar6 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + (uint)oldHufTable[lVar6].nbBits * *(int *)((long)workSpace + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar6);
        uVar5 = uVar5 >> 3;
      }
      if ((int)maxSymbolValue_local < 0) {
        uVar7 = 0;
      }
      else {
        lVar6 = 0;
        uVar7 = 0;
        do {
          uVar7 = uVar7 + (uint)*(byte *)((long)workSpace + lVar6 * 4 + 0x402) *
                          *(int *)((long)workSpace + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while ((ulong)maxSymbolValue_local + 1 != lVar6);
        uVar7 = uVar7 >> 3;
      }
      if (srcSize <= sVar3 + 0xc || uVar5 <= uVar7 + sVar3) {
        sVar3 = HUF_compressCTable_internal
                          ((BYTE *)dst,(BYTE *)dst,local_40,src,srcSize,nbStreams,oldHufTable,bmi2);
        goto LAB_00138eb1;
      }
    }
    if (sVar3 + 0xc < srcSize) {
      if (repeat != (HUF_repeat *)0x0) {
        *repeat = HUF_repeat_none;
      }
      pBVar8 = (BYTE *)(sVar3 + (long)dst);
      bVar1 = true;
      sVar3 = sVar2;
      if (oldHufTable != (HUF_CElt *)0x0) {
        memcpy(oldHufTable,local_48,0x400);
      }
    }
    else {
      bVar1 = false;
      sVar3 = 0;
    }
  }
  else {
LAB_00138eb1:
    bVar1 = false;
  }
  oldHufTable = local_48;
  if (!bVar1) {
    return sVar3;
  }
LAB_00138fb5:
  sVar3 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar8,local_40,src,srcSize,nbStreams,oldHufTable,bmi2);
  return sVar3;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                 const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < HUF_WORKSPACE_SIZE) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, workSpace, wkspSize) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            table->nodeTable, sizeof(table->nodeTable));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, bmi2);
}